

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncLogging.h
# Opt level: O2

void __thiscall AsyncLogging::~AsyncLogging(AsyncLogging *this)

{
  if (this->running_ == true) {
    stop(this);
  }
  CountDownLatch::~CountDownLatch(&this->latch_);
  std::
  vector<std::shared_ptr<FixedBuffer<4000000>_>,_std::allocator<std::shared_ptr<FixedBuffer<4000000>_>_>_>
  ::~vector(&this->buffers_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->currentBuffer_).
              super___shared_ptr<FixedBuffer<4000000>,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  pthread_cond_destroy((pthread_cond_t *)&(this->cond_).cond);
  pthread_mutex_destroy((pthread_mutex_t *)&this->mutex_);
  Thread::~Thread(&this->thread_);
  std::__cxx11::string::~string((string *)&this->basename_);
  return;
}

Assistant:

~AsyncLogging() {
        if(running_) stop();
    }